

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobotDynamics.cpp
# Opt level: O3

void __thiscall RobotDynamics::~RobotDynamics(RobotDynamics *this)

{
  pointer pdVar1;
  pointer pMVar2;
  pointer pMVar3;
  
  pdVar1 = (this->friction).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  pdVar1 = (this->damping).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  pdVar1 = (this->m).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  pMVar2 = (this->I).
           super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pMVar2 != (pointer)0x0) {
    operator_delete(pMVar2);
  }
  pMVar3 = (this->PC).
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pMVar3 != (pointer)0x0) {
    operator_delete(pMVar3);
    return;
  }
  return;
}

Assistant:

RobotDynamics::~RobotDynamics() {}